

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  size_t sVar1;
  float fVar2;
  float x0;
  float y0;
  ImVec2 IVar3;
  ushort uVar4;
  ushort uVar5;
  ImFont *pIVar6;
  ImFont **ppIVar7;
  uint uVar8;
  uint *puVar9;
  ulong uVar10;
  int off_y_1;
  long lVar11;
  uchar *puVar12;
  uint *puVar13;
  int iVar14;
  uint uVar15;
  int off_x;
  ulong uVar16;
  char *pcVar17;
  ImFontAtlasCustomRect *pIVar18;
  int off_y;
  int iVar19;
  uint uVar20;
  uint uVar21;
  int off_y_2;
  int off_x_2;
  size_t __n;
  long lVar22;
  int iVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  int iVar31;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  long local_48;
  
  iVar14 = atlas->PackIdMouseCursors;
  pIVar18 = (atlas->CustomRects).Data;
  lVar11 = (long)atlas->TexWidth;
  uVar10 = (ulong)pIVar18[iVar14].X;
  if ((atlas->Flags & 2) == 0) {
    uVar16 = (ulong)pIVar18[iVar14].Y;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar9 = atlas->TexPixelsRGBA32;
      puVar13 = puVar9 + (ulong)pIVar18[iVar14].X + lVar11 * uVar16;
      pcVar17 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar19 = 0;
      do {
        lVar11 = 0;
        do {
          puVar13[lVar11] = -(uint)(pcVar17[lVar11] == '.');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x7a);
        iVar19 = iVar19 + 1;
        puVar13 = puVar13 + atlas->TexWidth;
        pcVar17 = pcVar17 + 0x7a;
      } while (iVar19 != 0x1b);
      puVar9 = puVar9 + uVar10 + 0x7b + (long)atlas->TexWidth * uVar16;
      pcVar17 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar19 = 0;
      do {
        lVar11 = 0;
        do {
          puVar9[lVar11] = -(uint)(pcVar17[lVar11] == 'X');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x7a);
        iVar19 = iVar19 + 1;
        puVar9 = puVar9 + atlas->TexWidth;
        pcVar17 = pcVar17 + 0x7a;
      } while (iVar19 != 0x1b);
    }
    else {
      puVar12 = atlas->TexPixelsAlpha8 + lVar11 * uVar16 + uVar10;
      pcVar17 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar19 = 0;
      do {
        lVar11 = 0;
        do {
          puVar12[lVar11] = -(pcVar17[lVar11] == '.');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x7a);
        iVar19 = iVar19 + 1;
        puVar12 = puVar12 + atlas->TexWidth;
        pcVar17 = pcVar17 + 0x7a;
      } while (iVar19 != 0x1b);
      puVar12 = atlas->TexPixelsAlpha8 +
                (long)atlas->TexWidth * (ulong)pIVar18[iVar14].Y + uVar10 + 0x7b;
      pcVar17 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar19 = 0;
      do {
        lVar11 = 0;
        do {
          puVar12[lVar11] = -(pcVar17[lVar11] == 'X');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x7a);
        iVar19 = iVar19 + 1;
        puVar12 = puVar12 + atlas->TexWidth;
        pcVar17 = pcVar17 + 0x7a;
      } while (iVar19 != 0x1b);
    }
  }
  else {
    lVar22 = (ulong)pIVar18[iVar14].Y * lVar11 + uVar10;
    iVar19 = (int)lVar22;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar9 = atlas->TexPixelsRGBA32;
      puVar13 = puVar9 + (atlas->TexWidth + iVar19);
      puVar13[0] = 0xffffffff;
      puVar13[1] = 0xffffffff;
      puVar9 = puVar9 + iVar19;
      puVar9[0] = 0xffffffff;
      puVar9[1] = 0xffffffff;
    }
    else {
      lVar11 = iVar19 + lVar11;
      atlas->TexPixelsAlpha8[lVar11 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar11] = 0xff;
      atlas->TexPixelsAlpha8[lVar22 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar22] = 0xff;
    }
  }
  uVar8._0_2_ = pIVar18[iVar14].X;
  uVar8._2_2_ = pIVar18[iVar14].Y;
  IVar3 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar3.x * ((float)(uVar8 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar3.y * ((float)(uVar8 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar18 = (atlas->CustomRects).Data + atlas->PackIdLines;
    local_48 = 0;
    iVar14 = 0;
    __n = 0;
    auVar32 = _DAT_001e93b0;
    do {
      uVar4 = pIVar18->Width;
      iVar19 = (int)__n;
      uVar8 = (uint)uVar4 - iVar19;
      uVar15 = uVar8 >> 1;
      uVar10 = (ulong)uVar15;
      uVar20 = iVar19 + uVar15;
      uVar21 = (uint)uVar4;
      if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
        puVar13 = atlas->TexPixelsRGBA32;
        uVar16 = (ulong)(((uint)pIVar18->Y + iVar19) * atlas->TexWidth + (uint)pIVar18->X);
        if (1 < uVar8) {
          uVar8 = iVar14 + (uint)uVar4 >> 1;
          lVar11 = (ulong)(uVar8 + (uVar8 == 0)) - 1;
          auVar23._8_4_ = (int)lVar11;
          auVar23._0_8_ = lVar11;
          auVar23._12_4_ = (int)((ulong)lVar11 >> 0x20);
          lVar11 = 0;
          auVar28 = _DAT_001e96a0;
          auVar26 = _DAT_001e9690;
          do {
            auVar27 = auVar23 ^ auVar32;
            auVar30 = auVar28 ^ auVar32;
            iVar25 = auVar27._4_4_;
            if ((bool)(~(iVar25 < auVar30._4_4_ ||
                        auVar27._0_4_ < auVar30._0_4_ && auVar30._4_4_ == iVar25) & 1)) {
              *(undefined4 *)((long)puVar13 + lVar11 + uVar16 * 4) = 0xffffff;
            }
            if (auVar30._12_4_ <= auVar27._12_4_ &&
                (auVar30._8_4_ <= auVar27._8_4_ || auVar30._12_4_ != auVar27._12_4_)) {
              *(undefined4 *)((long)puVar13 + lVar11 + uVar16 * 4 + 4) = 0xffffff;
            }
            iVar31 = SUB164(auVar26 ^ auVar32,4);
            if (iVar31 <= iVar25 &&
                (iVar31 != iVar25 || SUB164(auVar26 ^ auVar32,0) <= auVar27._0_4_)) {
              *(undefined4 *)((long)puVar13 + lVar11 + uVar16 * 4 + 8) = 0xffffff;
              *(undefined4 *)((long)puVar13 + lVar11 + uVar16 * 4 + 0xc) = 0xffffff;
            }
            lVar22 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 4;
            auVar28._8_8_ = lVar22 + 4;
            lVar22 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 4;
            auVar26._8_8_ = lVar22 + 4;
            lVar11 = lVar11 + 0x10;
          } while ((ulong)(uVar8 + (uVar8 == 0) + 3 & 0xfffffffc) << 2 != lVar11);
        }
        if (__n != 0) {
          memset(puVar13 + uVar16 + uVar10,0xff,__n * 4);
          auVar32 = _DAT_001e93b0;
        }
        if (uVar4 != uVar20) {
          uVar8 = uVar21 + iVar14 >> 1;
          uVar20 = (uVar21 + iVar14) - uVar8;
          lVar11 = (ulong)(uVar20 + (uVar20 == 0)) - 1;
          auVar24._8_4_ = (int)lVar11;
          auVar24._0_8_ = lVar11;
          auVar24._12_4_ = (int)((ulong)lVar11 >> 0x20);
          lVar11 = local_48 + (ulong)uVar8 * 4 + uVar16 * 4;
          auVar24 = auVar24 ^ auVar32;
          uVar10 = 0;
          auVar27 = _DAT_001e96a0;
          auVar30 = _DAT_001e9690;
          do {
            auVar28 = auVar27 ^ auVar32;
            iVar25 = auVar24._4_4_;
            if ((bool)(~(auVar28._4_4_ == iVar25 && auVar24._0_4_ < auVar28._0_4_ ||
                        iVar25 < auVar28._4_4_) & 1)) {
              *(undefined4 *)((long)puVar13 + uVar10 + lVar11) = 0xffffff;
            }
            if ((auVar28._12_4_ != auVar24._12_4_ || auVar28._8_4_ <= auVar24._8_4_) &&
                auVar28._12_4_ <= auVar24._12_4_) {
              *(undefined4 *)((long)puVar13 + uVar10 + lVar11 + 4) = 0xffffff;
            }
            iVar31 = SUB164(auVar30 ^ auVar32,4);
            if (iVar31 <= iVar25 &&
                (iVar31 != iVar25 || SUB164(auVar30 ^ auVar32,0) <= auVar24._0_4_)) {
              *(undefined4 *)((long)puVar13 + uVar10 + lVar11 + 8) = 0xffffff;
              *(undefined4 *)((long)puVar13 + uVar10 + lVar11 + 0xc) = 0xffffff;
            }
            lVar22 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 4;
            auVar27._8_8_ = lVar22 + 4;
            lVar22 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 4;
            auVar30._8_8_ = lVar22 + 4;
            uVar10 = uVar10 + 0x10;
          } while ((((ulong)uVar20 + (ulong)((ulong)uVar20 == 0)) * 4 + 0xc & 0x7fffffff0) != uVar10
                  );
        }
      }
      else {
        puVar12 = atlas->TexPixelsAlpha8 +
                  (((uint)pIVar18->Y + iVar19) * atlas->TexWidth + (uint)pIVar18->X);
        if (1 < uVar8) {
          memset(puVar12,0,uVar10);
          auVar32 = _DAT_001e93b0;
        }
        if (__n != 0) {
          memset(puVar12 + uVar10,0xff,__n);
          auVar32 = _DAT_001e93b0;
        }
        if (uVar21 != uVar20) {
          memset(puVar12 + uVar10 + __n,0,(ulong)((uVar21 - uVar20) + (uint)(uVar21 - uVar20 == 0)))
          ;
          auVar32 = _DAT_001e93b0;
        }
      }
      uVar4 = pIVar18->X;
      uVar5 = pIVar18->Y;
      fVar2 = (atlas->TexUvScale).x;
      fVar29 = (atlas->TexUvScale).y;
      sVar1 = __n + 1;
      atlas->TexUvLines[__n].x = (float)((uVar4 + uVar15) - 1) * fVar2;
      fVar29 = ((float)(int)(uVar5 + 1 + iVar19) * fVar29 +
               (float)(int)((uint)uVar5 + iVar19) * fVar29) * 0.5;
      atlas->TexUvLines[__n].y = fVar29;
      atlas->TexUvLines[__n].z = fVar2 * (float)((uint)uVar4 + (int)sVar1 + uVar15);
      atlas->TexUvLines[__n].w = fVar29;
      iVar14 = iVar14 + -1;
      local_48 = local_48 + 4;
      __n = sVar1;
    } while (sVar1 != 0x40);
  }
  iVar14 = (atlas->CustomRects).Size;
  if (0 < iVar14) {
    lVar11 = 0;
    lVar22 = 0;
    do {
      pIVar18 = (atlas->CustomRects).Data;
      pIVar6 = *(ImFont **)((long)&pIVar18->Font + lVar11);
      if ((pIVar6 != (ImFont *)0x0) &&
         (iVar19 = *(int *)((long)&pIVar18->GlyphID + lVar11), iVar19 != 0)) {
        uVar8 = (uint)*(ushort *)((long)&pIVar18->X + lVar11);
        fVar2 = (atlas->TexUvScale).x;
        fVar29 = (atlas->TexUvScale).y;
        uVar20 = (uint)*(ushort *)((long)&pIVar18->Y + lVar11);
        uVar21 = (uint)*(ushort *)((long)&pIVar18->Width + lVar11);
        uVar15 = (uint)*(ushort *)((long)&pIVar18->Height + lVar11);
        x0 = *(float *)((long)&(pIVar18->GlyphOffset).x + lVar11);
        y0 = *(float *)((long)&(pIVar18->GlyphOffset).y + lVar11);
        ImFont::AddGlyph(pIVar6,(ImFontConfig *)0x0,(ImWchar)iVar19,x0,y0,(float)uVar21 + x0,
                         (float)uVar15 + y0,(float)uVar8 * fVar2,(float)uVar20 * fVar29,
                         (float)(uVar8 + uVar21) * fVar2,(float)(uVar20 + uVar15) * fVar29,
                         *(float *)((long)&pIVar18->GlyphAdvanceX + lVar11));
        iVar14 = (atlas->CustomRects).Size;
      }
      lVar22 = lVar22 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar22 < iVar14);
  }
  lVar11 = (long)(atlas->Fonts).Size;
  if (lVar11 != 0) {
    ppIVar7 = (atlas->Fonts).Data;
    lVar22 = 0;
    do {
      pIVar6 = *(ImFont **)((long)ppIVar7 + lVar22);
      if (pIVar6->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar6);
      }
      lVar22 = lVar22 + 8;
    } while (lVar11 * 8 != lVar22);
  }
  atlas->TexReady = true;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (ImFont* font : atlas->Fonts)
        if (font->DirtyLookupTables)
            font->BuildLookupTable();

    atlas->TexReady = true;
}